

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

realtype N_VWrmsNormMask_SensWrapper(N_Vector x,N_Vector w,N_Vector id)

{
  long *plVar1;
  long lVar2;
  realtype rVar3;
  double dVar4;
  
  plVar1 = (long *)x->content;
  if ((int)plVar1[1] < 1) {
    rVar3 = 0.0;
  }
  else {
    lVar2 = 0;
    dVar4 = 0.0;
    do {
      rVar3 = N_VWrmsNormMask(*(N_Vector *)(*plVar1 + lVar2 * 8),
                              *(N_Vector *)(*w->content + lVar2 * 8),
                              *(N_Vector *)(*id->content + lVar2 * 8));
      if (rVar3 <= dVar4) {
        rVar3 = dVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
      dVar4 = rVar3;
    } while (lVar2 < (int)plVar1[1]);
  }
  return rVar3;
}

Assistant:

realtype N_VWrmsNormMask_SensWrapper(N_Vector x, N_Vector w, N_Vector id)
{
  int i;
  realtype nrm, tmp;

  nrm = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VWrmsNormMask(NV_VEC_SW(x,i), NV_VEC_SW(w,i), NV_VEC_SW(id,i));
    if (tmp > nrm) nrm = tmp;
  }

  return(nrm);
}